

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strdup.c
# Opt level: O0

void * Curl_memdup0(char *src,size_t length)

{
  char *buf;
  size_t length_local;
  char *src_local;
  
  src_local = (char *)(*Curl_cmalloc)(length + 1);
  if (src_local == (char *)0x0) {
    src_local = (char *)0x0;
  }
  else {
    memcpy(src_local,src,length);
    src_local[length] = '\0';
  }
  return src_local;
}

Assistant:

void *Curl_memdup0(const char *src, size_t length)
{
  char *buf = malloc(length + 1);
  if(!buf)
    return NULL;
  memcpy(buf, src, length);
  buf[length] = 0;
  return buf;
}